

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall embree::TutorialApplication::~TutorialApplication(TutorialApplication *this)

{
  PerspectiveCameraNode *pPVar1;
  
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__TutorialApplication_002a4e18;
  g_ispc_scene = (ISPCScene *)0x0;
  std::__uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::reset
            ((__uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *)
             &this->ispc_scene,(pointer)0x0);
  device_cleanup();
  if (g_device != (RTCDevice)0x0) {
    rtcReleaseDevice();
  }
  alignedUSMFree(this->pixels);
  this->width = 0;
  this->height = 0;
  this->pixels = (uint *)0x0;
  alignedFree(g_stats);
  g_stats = (RayStats *)0x0;
  std::unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::~unique_ptr
            (&this->ispc_scene);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_mrayps);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_frame_time);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base((_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                *)&this->avg_render_time);
  std::__cxx11::string::~string((string *)&this->referenceImageFilename);
  std::__cxx11::string::~string((string *)&this->outputImageFilename);
  pPVar1 = (this->animated_camera).ptr;
  if (pPVar1 != (PerspectiveCameraNode *)0x0) {
    (*(pPVar1->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&this->tutorialName);
  Application::~Application(&this->super_Application);
  return;
}

Assistant:

TutorialApplication::~TutorialApplication()
  {
    g_ispc_scene = nullptr;
    ispc_scene = nullptr;
    device_cleanup();
    if (g_device) rtcReleaseDevice(g_device);
    alignedUSMFree(pixels);
    pixels = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    delete device; device = nullptr;
    delete queue; queue = nullptr;
    delete context; context = nullptr;
#endif
    
    width = 0;
    height = 0;
    alignedFree(g_stats);
    g_stats = nullptr;

#if defined(EMBREE_SYCL_SUPPORT)
    
    if (features & FEATURE_SYCL)
      disableUSMAllocTutorial();

#endif
  }